

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.hpp
# Opt level: O0

void __thiscall
Fossilize::CLICallbacks::add
          (CLICallbacks *this,char *cli,function<void_(Fossilize::CLIParser_&)> *func)

{
  mapped_type *this_00;
  allocator local_41;
  key_type local_40;
  function<void_(Fossilize::CLIParser_&)> *local_20;
  function<void_(Fossilize::CLIParser_&)> *func_local;
  char *cli_local;
  CLICallbacks *this_local;
  
  local_20 = func;
  func_local = (function<void_(Fossilize::CLIParser_&)> *)cli;
  cli_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,cli,&local_41);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>_>
            ::operator[](&this->callbacks,&local_40);
  std::function<void_(Fossilize::CLIParser_&)>::operator=(this_00,func);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void add(const char *cli, const std::function<void(CLIParser &)> &func)
	{
		callbacks[cli] = func;
	}